

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_sse41.h
# Opt level: O2

void __thiscall highwayhash::SSE41::HHStateSSE41::Finalize(HHStateSSE41 *this,HHResult128 *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  
  iVar5 = 6;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    PermuteAndUpdate(this);
  }
  lVar1 = (this->mul0L).v_[1];
  lVar2 = (this->v0L).v_[1];
  lVar3 = (this->v1H).v_[1];
  lVar4 = (this->mul1H).v_[1];
  (*result)[0] = (this->mul0L).v_[0] + (this->v0L).v_[0] + (this->v1H).v_[0] + (this->mul1H).v_[0];
  (*result)[1] = lVar1 + lVar2 + lVar3 + lVar4;
  return;
}

Assistant:

HH_INLINE void Finalize(HHResult128* HH_RESTRICT result) {
    for (int n = 0; n < 6; n++) {
      PermuteAndUpdate();
    }

    const V2x64U sum0 = v0L + mul0L;
    const V2x64U sum1 = v1H + mul1H;
    const V2x64U hash = sum0 + sum1;
    StoreUnaligned(hash, &(*result)[0]);
  }